

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O1

void duckdb::ListCombineFunction
               (Vector *states_vector,Vector *combined,AggregateInputData *aggr_input_data,
               idx_t count)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  FunctionData *pFVar5;
  Vector *pVVar6;
  RecursiveUnifiedVectorFormat *pRVar7;
  LogicalType *pLVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  idx_t iVar12;
  LinkedList *pLVar13;
  LogicalType result_type;
  RecursiveUnifiedVectorFormat input_data;
  UnifiedVectorFormat states_data;
  Vector input;
  ulong local_1b0;
  LogicalType local_188 [24];
  undefined1 local_170 [64];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
  local_128;
  LogicalType local_110 [24];
  LogicalType local_f8 [24];
  long *local_e0;
  long local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  Vector local_98 [8];
  LogicalType local_90 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (aggr_input_data->combine_type == ALLOW_DESTRUCTIVE) {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_170);
    duckdb::Vector::ToUnifiedFormat((ulong)states_vector,(UnifiedVectorFormat *)count);
    if (count != 0) {
      lVar1 = *(long *)(combined + 0x20);
      iVar10 = 0;
      do {
        iVar12 = iVar10;
        if (*(long *)local_170._0_8_ != 0) {
          iVar12 = (idx_t)*(uint *)(*(long *)local_170._0_8_ + iVar10 * 4);
        }
        plVar2 = *(long **)(local_170._8_8_ + iVar12 * 8);
        lVar3 = *plVar2;
        if (lVar3 != 0) {
          plVar4 = *(long **)(lVar1 + iVar10 * 8);
          if (*plVar4 == 0) {
            plVar4[2] = plVar2[2];
            lVar3 = plVar2[1];
            *plVar4 = *plVar2;
            plVar4[1] = lVar3;
          }
          else {
            *(long *)(plVar4[2] + 8) = plVar2[1];
            *(long *)(*(long *)(lVar1 + iVar10 * 8) + 0x10) = plVar2[2];
            plVar2 = *(long **)(lVar1 + iVar10 * 8);
            *plVar2 = *plVar2 + lVar3;
          }
        }
        iVar10 = iVar10 + 1;
      } while (count != iVar10);
    }
    local_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._32_8_;
    if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
      local_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._32_8_;
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_e0);
    duckdb::Vector::ToUnifiedFormat((ulong)states_vector,(UnifiedVectorFormat *)count);
    lVar1 = *(long *)(combined + 0x20);
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&aggr_input_data->bind_data);
    pFVar5 = (aggr_input_data->bind_data).ptr;
    pLVar8 = (LogicalType *)duckdb::ListType::GetChildType((LogicalType *)(pFVar5 + 8));
    duckdb::LogicalType::LogicalType(local_188,pLVar8);
    if (count != 0) {
      pLVar13 = (LinkedList *)(pFVar5 + 0x20);
      uVar11 = 0;
      do {
        uVar9 = uVar11;
        if (*local_e0 != 0) {
          uVar9 = (ulong)*(uint *)(*local_e0 + uVar11 * 4);
        }
        pVVar6 = *(Vector **)(local_d8 + uVar9 * 8);
        pRVar7 = *(RecursiveUnifiedVectorFormat **)(lVar1 + uVar11 * 8);
        uVar9 = *(ulong *)pVVar6;
        duckdb::LogicalType::LogicalType(local_f8,local_188);
        duckdb::Vector::Vector(local_98,local_f8,*(undefined8 *)pVVar6);
        duckdb::LogicalType::~LogicalType(local_f8);
        duckdb::ListSegmentFunctions::BuildListVector(pLVar13,pVVar6,(ulong)local_98);
        duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_170);
        local_128.
        super__Vector_base<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.
        super__Vector_base<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128.
        super__Vector_base<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        duckdb::LogicalType::LogicalType(local_110);
        duckdb::Vector::RecursiveToUnifiedFormat
                  (local_98,uVar9,(RecursiveUnifiedVectorFormat *)local_170);
        local_1b0 = 0;
        if (uVar9 != 0) {
          do {
            duckdb::ArenaAllocator::AlignNext();
            duckdb::ListSegmentFunctions::AppendRow
                      ((ArenaAllocator *)pLVar13,(LinkedList *)aggr_input_data->allocator,pRVar7,
                       (ulong *)local_170);
            local_1b0 = local_1b0 + 1;
          } while (local_1b0 < uVar9);
        }
        duckdb::LogicalType::~LogicalType(local_110);
        std::
        vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
        ::~vector(&local_128);
        if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._32_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._32_8_);
        }
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        }
        if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
        }
        if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
        }
        duckdb::LogicalType::~LogicalType(local_90);
        uVar11 = uVar11 + 1;
      } while (uVar11 != count);
    }
    duckdb::LogicalType::~LogicalType(local_188);
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
    }
  }
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  return;
}

Assistant:

static void ListCombineFunction(Vector &states_vector, Vector &combined, AggregateInputData &aggr_input_data,
                                idx_t count) {

	//	Can we use destructive combining?
	if (aggr_input_data.combine_type == AggregateCombineType::ALLOW_DESTRUCTIVE) {
		ListAbsorbFunction(states_vector, combined, aggr_input_data, count);
		return;
	}

	UnifiedVectorFormat states_data;
	states_vector.ToUnifiedFormat(count, states_data);
	auto states_ptr = UnifiedVectorFormat::GetData<const ListAggState *>(states_data);
	auto combined_ptr = FlatVector::GetData<ListAggState *>(combined);

	auto &list_bind_data = aggr_input_data.bind_data->Cast<ListBindData>();
	auto result_type = ListType::GetChildType(list_bind_data.stype);

	for (idx_t i = 0; i < count; i++) {
		auto &source = *states_ptr[states_data.sel->get_index(i)];
		auto &target = *combined_ptr[i];

		const auto entry_count = source.linked_list.total_capacity;
		Vector input(result_type, source.linked_list.total_capacity);
		list_bind_data.functions.BuildListVector(source.linked_list, input, 0);

		RecursiveUnifiedVectorFormat input_data;
		Vector::RecursiveToUnifiedFormat(input, entry_count, input_data);

		for (idx_t entry_idx = 0; entry_idx < entry_count; ++entry_idx) {
			aggr_input_data.allocator.AlignNext();
			list_bind_data.functions.AppendRow(aggr_input_data.allocator, target.linked_list, input_data, entry_idx);
		}
	}
}